

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaQNameRefPtr
xmlSchemaCheckAttrGroupCircularRecur
          (xmlSchemaAttributeGroupPtr_conflict ctxtGr,xmlSchemaItemListPtr list)

{
  uint uVar1;
  xmlSchemaAttributeGroupPtr_conflict pxVar2;
  xmlSchemaQNameRefPtr pxVar3;
  long lVar4;
  
  if (list->nbItems < 1) {
    return (xmlSchemaQNameRefPtr)0x0;
  }
  lVar4 = 0;
  do {
    pxVar3 = (xmlSchemaQNameRefPtr)list->items[lVar4];
    if (((pxVar3->type == XML_SCHEMA_EXTRA_QNAMEREF) &&
        (pxVar3->itemType == XML_SCHEMA_TYPE_ATTRIBUTEGROUP)) &&
       (pxVar2 = (xmlSchemaAttributeGroupPtr_conflict)pxVar3->item,
       pxVar2 != (xmlSchemaAttributeGroupPtr_conflict)0x0)) {
      if (pxVar2 == ctxtGr) {
        return pxVar3;
      }
      uVar1 = pxVar2->flags;
      if (((uVar1 & 4) == 0) &&
         ((uVar1 & 0x10) != 0 && (xmlSchemaItemListPtr)pxVar2->attrUses != (xmlSchemaItemListPtr)0x0
         )) {
        pxVar2->flags = uVar1 | 4;
        pxVar3 = xmlSchemaCheckAttrGroupCircularRecur(ctxtGr,(xmlSchemaItemListPtr)pxVar2->attrUses)
        ;
        *(byte *)&pxVar2->flags = (byte)pxVar2->flags ^ 4;
        if (pxVar3 != (xmlSchemaQNameRefPtr)0x0) {
          return pxVar3;
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 < list->nbItems);
  return (xmlSchemaQNameRefPtr)0x0;
}

Assistant:

static xmlSchemaQNameRefPtr
xmlSchemaCheckAttrGroupCircularRecur(xmlSchemaAttributeGroupPtr ctxtGr,
				     xmlSchemaItemListPtr list)
{
    xmlSchemaAttributeGroupPtr gr;
    xmlSchemaQNameRefPtr ref, circ;
    int i;
    /*
    * We will search for an attribute group reference which
    * references the context attribute group.
    */
    for (i = 0; i < list->nbItems; i++) {
	ref = list->items[i];
	if ((ref->type == XML_SCHEMA_EXTRA_QNAMEREF) &&
	    (ref->itemType == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) &&
	    (ref->item != NULL))
	{
	    gr = WXS_ATTR_GROUP_CAST ref->item;
	    if (gr == ctxtGr)
		return(ref);
	    if (gr->flags & XML_SCHEMAS_ATTRGROUP_MARKED)
		continue;
	    /*
	    * Mark as visited to avoid infinite recursion on
	    * circular references not yet examined.
	    */
	    if ((gr->attrUses) &&
		(gr->flags & XML_SCHEMAS_ATTRGROUP_HAS_REFS))
	    {
		gr->flags |= XML_SCHEMAS_ATTRGROUP_MARKED;
		circ = xmlSchemaCheckAttrGroupCircularRecur(ctxtGr,
		    (xmlSchemaItemListPtr) gr->attrUses);
		gr->flags ^= XML_SCHEMAS_ATTRGROUP_MARKED;
		if (circ != NULL)
		    return (circ);
	    }

	}
    }
    return (NULL);
}